

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall hello::form(hello *this)

{
  bool bVar1;
  byte bVar2;
  boundary_type extraout_var;
  string *str;
  char *name_00;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 uVar4;
  my_form *this_00;
  double dVar5;
  form_context context;
  ofstream tmp;
  string descr;
  string name;
  locale loc;
  bool ok;
  my_form f;
  char *in_stack_ffffffffffffdfa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdfb0;
  locale *in_stack_ffffffffffffdfd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdfd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdfe0;
  numeric<double> *in_stack_ffffffffffffdff0;
  boundary_type type;
  undefined7 in_stack_ffffffffffffe100;
  byte in_stack_ffffffffffffe107;
  form_context local_1ed8 [40];
  string local_1eb0 [32];
  string local_1e90 [32];
  string local_1e70 [32];
  string local_1e50 [32];
  ostream local_1e30 [512];
  string local_1c30 [32];
  string local_1c10 [32];
  string local_1bf0 [32];
  string local_1bd0 [32];
  string local_1bb0 [32];
  string local_1b90 [32];
  locale local_1b70 [24];
  request local_1b58 [39];
  byte local_1b31;
  context local_1b30 [208];
  my_form *in_stack_ffffffffffffe5a0;
  
  my_form::my_form(in_stack_ffffffffffffe5a0);
  local_1b31 = 0;
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_(local_1b58);
  bVar1 = std::operator==(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  std::__cxx11::string::~string((string *)local_1b58);
  if (bVar1) {
    cppcms::application::context();
    cppcms::form::load(local_1b30);
    in_stack_ffffffffffffe107 = cppcms::form::validate();
    if ((in_stack_ffffffffffffe107 & 1) != 0) {
      local_1b31 = 1;
    }
  }
  cppcms::application::response();
  type = extraout_var;
  str = (string *)cppcms::http::response::out();
  std::operator<<((ostream *)str,"<html><body>\n");
  name_00 = (char *)cppcms::application::context();
  cppcms::http::context::locale();
  bVar2 = cppcms::widgets::base_widget::set();
  if ((bVar2 & 1) != 0) {
    cppcms::widgets::base_text::value_abi_cxx11_();
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    poVar3 = std::operator<<(poVar3,"Upper: ");
    booster::locale::to_upper<char>(in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd0);
    poVar3 = std::operator<<(poVar3,local_1bb0);
    poVar3 = std::operator<<(poVar3,"<br>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1bb0);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    poVar3 = std::operator<<(poVar3,"Lower: ");
    booster::locale::to_lower<char>(in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd0);
    poVar3 = std::operator<<(poVar3,local_1bd0);
    poVar3 = std::operator<<(poVar3,"<br>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1bd0);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    poVar3 = std::operator<<(poVar3,"Title: ");
    booster::locale::to_title<char>(in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd0);
    poVar3 = std::operator<<(poVar3,local_1bf0);
    poVar3 = std::operator<<(poVar3,"<br>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1bf0);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    poVar3 = std::operator<<(poVar3,"Fold Case: ");
    booster::locale::fold_case<char>(in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd0);
    poVar3 = std::operator<<(poVar3,local_1c10);
    poVar3 = std::operator<<(poVar3,"<br>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1c10);
    std::__cxx11::string::~string(local_1b90);
  }
  bVar2 = cppcms::widgets::base_widget::set();
  if ((bVar2 & 1) != 0) {
    cppcms::widgets::base_text::value_abi_cxx11_();
    bVar2 = cppcms::widgets::base_widget::valid();
    if ((bVar2 & 1) == 0) {
      std::ofstream::ofstream(local_1e30,"test.txt",0x10);
      std::operator<<(local_1e30,local_1c30);
      std::ofstream::~ofstream(local_1e30);
    }
    devide((hello *)CONCAT17(in_stack_ffffffffffffe107,in_stack_ffffffffffffe100),type,str,name_00);
    devide((hello *)CONCAT17(in_stack_ffffffffffffe107,in_stack_ffffffffffffe100),type,str,name_00);
    devide((hello *)CONCAT17(in_stack_ffffffffffffe107,in_stack_ffffffffffffe100),type,str,name_00);
    devide((hello *)CONCAT17(in_stack_ffffffffffffe107,in_stack_ffffffffffffe100),type,str,name_00);
    std::__cxx11::string::~string(local_1c30);
  }
  if ((local_1b31 & 1) != 0) {
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    cppcms::widgets::base_text::value_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_1e50);
    poVar3 = std::operator<<(poVar3," ");
    dVar5 = cppcms::widgets::numeric<double>::value(in_stack_ffffffffffffdff0);
    std::ostream::operator<<(poVar3,dVar5);
    std::__cxx11::string::~string(local_1e50);
    cppcms::form::clear();
  }
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  poVar3 = std::operator<<(poVar3,"<form action=\'");
  cppcms::application::request();
  cppcms::http::request::script_name_abi_cxx11_();
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          cppcms::application::request();
  cppcms::http::request::path_info_abi_cxx11_();
  std::operator+(__lhs,in_stack_ffffffffffffdfe0);
  poVar3 = std::operator<<(poVar3,local_1e70);
  std::operator<<(poVar3,"\' method=\'post\' enctype=\'multipart/form-data\' >\n<table>\n");
  std::__cxx11::string::~string(local_1e70);
  std::__cxx11::string::~string(local_1eb0);
  std::__cxx11::string::~string(local_1e90);
  cppcms::application::response();
  uVar4 = cppcms::http::response::out();
  cppcms::form_context::form_context(local_1ed8,uVar4,0);
  cppcms::form::render((form_context *)local_1b30);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"</table><input type=\'submit\' value=\'Send\' ></form>\n");
  cppcms::application::response();
  this_00 = (my_form *)cppcms::http::response::out();
  poVar3 = std::operator<<((ostream *)this_00,"</form></body></html>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cppcms::form_context::~form_context(local_1ed8);
  std::locale::~locale(local_1b70);
  my_form::~my_form(this_00);
  return;
}

Assistant:

void form()
	{
		my_form f;
		bool ok=false;
		if(request().request_method()=="POST") {
			f.load(context());
			if(f.validate()) {
				ok=true;	
			}
		}
		response().out()<<
			"<html><body>\n";
	
		std::locale loc = context().locale();

		if(f.name.set()) {
			using namespace cppcms::locale;
			std::string name = f.name.value();
			response().out() <<"Upper: "<<to_upper(name,loc)<<"<br>"<<std::endl;
			response().out() <<"Lower: "<<to_lower(name,loc)<<"<br>"<<std::endl;
			#ifndef CPPCMS_DISABLE_ICU_LOCALIZATION
			response().out() <<"Title: "<<to_title(name,loc)<<"<br>"<<std::endl;
			response().out() <<"Fold Case: "<<fold_case(name,loc)<<"<br>"<<std::endl;
			#endif

		}
		if(f.description.set()) {
			std::string descr = f.description.value();
			if(!f.description.valid()) {
				std::ofstream tmp("test.txt");
				tmp<<descr;
			}
			#ifndef CPPCMS_DISABLE_ICU_LOCALIZATION
			using namespace cppcms::locale;
			devide(boundary::character,descr,"code");
			devide(boundary::word,descr,"word");
			devide(boundary::sentence,descr,"sentence");
			devide(boundary::line,descr,"line");
			#endif
		}

		if(ok) {
			response().out() << f.name.value() <<" " <<f.age.value();
			f.clear();
		}


		
		response().out()<<
			"<form action='" <<
				request().script_name() + request().path_info()
			<<  "' method='post' enctype='multipart/form-data' >\n"
			"<table>\n";

		cppcms::form_context context(response().out());
		f.render(context);

		response().out()<<"</table><input type='submit' value='Send' ></form>\n";
		response().out()<<"</form></body></html>"<<std::endl;
	}